

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

shared_ptr<mir::types::VoidTy> mir::types::new_void_ty(void)

{
  element_type *in_RDI;
  shared_ptr<mir::types::VoidTy> sVar1;
  
  sVar1 = std::make_shared<mir::types::VoidTy>();
  sVar1.super___shared_ptr<mir::types::VoidTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<mir::types::VoidTy>)
         sVar1.super___shared_ptr<mir::types::VoidTy,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VoidTy> new_void_ty() { return std::make_shared<VoidTy>(); }